

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

void __thiscall
SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U>::insert
          (SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U> *this,uint *key)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  
  if (*key == 0) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0xd9,
                  "void SmallDenseSet<unsigned int, SmallDenseMapUnsignedHasher, 32>::insert(const Key &) [Key = unsigned int, Hasher = SmallDenseMapUnsignedHasher, N = 32]"
                 );
  }
  uVar4 = this->bucketCount;
  if (uVar4 <= (this->count >> 2) + this->count) {
    rehash(this);
    uVar4 = this->bucketCount;
    if (uVar4 == 0) goto LAB_001ca984;
  }
  uVar1 = uVar4 - 1;
  uVar2 = *key;
  uVar5 = uVar2 * -0x61c88647;
  iVar6 = 0;
  do {
    uVar5 = uVar5 & uVar1;
    uVar3 = this->data[uVar5];
    if (uVar3 == 0) {
      this->data[uVar5] = uVar2;
      this->count = this->count + 1;
      return;
    }
    if (uVar3 == uVar2) {
      return;
    }
    uVar5 = uVar5 + iVar6 + 1;
    iVar6 = iVar6 + 1;
    uVar4 = uVar4 - 1;
  } while (uVar4 != 0);
LAB_001ca984:
  __assert_fail("!\"couldn\'t insert node\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                ,0xf5,
                "void SmallDenseSet<unsigned int, SmallDenseMapUnsignedHasher, 32>::insert(const Key &) [Key = unsigned int, Hasher = SmallDenseMapUnsignedHasher, N = 32]"
               );
}

Assistant:

void insert(const Key& key)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Key &item = data[bucket];

			if(item == Key())
			{
				item = key;

				count++;
				return;
			}

			if(item == key)
				return;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}